

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

bool __thiscall AKey::HandlePickup(AKey *this,AInventory *item)

{
  bool bVar1;
  int iVar2;
  MetaClass *pMVar3;
  MetaClass *pMVar4;
  AInventory *pAVar5;
  AInventory *item_local;
  AKey *this_local;
  
  if (multiplayer) {
    this_local._7_1_ = AInventory::HandlePickup(&this->super_AInventory,item);
  }
  else {
    pMVar3 = AInventory::GetClass(&this->super_AInventory);
    pMVar4 = AInventory::GetClass(item);
    if (pMVar3 == pMVar4) {
      item->ItemFlags = item->ItemFlags | 4;
      this_local._7_1_ = true;
    }
    else {
      bVar1 = TObjPtr<AInventory>::operator!=
                        (&(this->super_AInventory).super_AActor.Inventory,(AInventory *)0x0);
      if (bVar1) {
        pAVar5 = TObjPtr<AInventory>::operator->(&(this->super_AInventory).super_AActor.Inventory);
        iVar2 = (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                          (pAVar5,item);
        this_local._7_1_ = (bool)((byte)iVar2 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AKey::HandlePickup (AInventory *item)
{
	// In single player, you can pick up an infinite number of keys
	// even though you can only hold one of each.
	if (multiplayer)
	{
		return Super::HandlePickup (item);
	}
	if (GetClass() == item->GetClass())
	{
		item->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}